

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_TimedTip(FParser *this)

{
  UCVarValue value;
  UCVarValue value_00;
  float fVar1;
  FFont *font;
  int iVar2;
  float local_20;
  undefined4 uStack_1c;
  
  fVar1 = con_midtime.Value;
  if (1 < this->t_argc) {
    iVar2 = intvalue(this->t_argv);
    local_20 = (float)iVar2 / 100.0;
    value._4_4_ = uStack_1c;
    value.Float = local_20;
    FBaseCVar::SetGenericRep(&con_midtime.super_FBaseCVar,value,CVAR_Float);
    font = SmallFont;
    GetFormatString((FParser *)&stack0xffffffffffffffe0,(int)this);
    C_MidPrint(font,(char *)CONCAT44(uStack_1c,local_20));
    FString::~FString((FString *)&stack0xffffffffffffffe0);
    local_20 = fVar1;
    value_00._4_4_ = uStack_1c;
    value_00.Float = fVar1;
    FBaseCVar::SetGenericRep(&con_midtime.super_FBaseCVar,value_00,CVAR_Float);
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_TimedTip(void)
{
	if (CheckArgs(2))
	{
		float saved = con_midtime;
		con_midtime = intvalue(t_argv[0])/100.0f;
		C_MidPrint(SmallFont, GetFormatString(1).GetChars());
		con_midtime=saved;
	}
}